

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.h
# Opt level: O0

int R_PointOnSide(DVector2 *pos,node_t *node)

{
  int iVar1;
  int iVar2;
  fixed_t fVar3;
  fixed_t fVar4;
  SDWORD SVar5;
  node_t *node_local;
  DVector2 *pos_local;
  
  fVar3 = FloatToFixed(pos->Y);
  iVar1 = node->y;
  SVar5 = node->dx;
  iVar2 = node->x;
  fVar4 = FloatToFixed(pos->X);
  SVar5 = DMulScale32(fVar3 - iVar1,SVar5,iVar2 - fVar4,node->dy);
  return (int)(0 < SVar5);
}

Assistant:

inline int R_PointOnSide(const DVector2 &pos, const node_t *node)
{
	return DMulScale32(FLOAT2FIXED(pos.Y) - node->y, node->dx, node->x - FLOAT2FIXED(pos.X), node->dy) > 0;
}